

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp.cpp
# Opt level: O1

MPP_RET __thiscall Mpp::enqueue(Mpp *this,MppPortType type,MppTask task)

{
  MPP_RET MVar1;
  RK_U32 flag;
  MppPort port;
  
  if (this->mInitDone != 0) {
    set_io_mode(this,MPP_IO_MODE_TASK);
    if (type == MPP_PORT_OUTPUT) {
      port = this->mUsrOutPort;
      flag = 8;
    }
    else if (type == MPP_PORT_INPUT) {
      port = this->mUsrInPort;
      flag = 1;
    }
    else {
      port = (MppPort)0x0;
      flag = 0;
    }
    if (port == (MppPort)0x0) {
      MVar1 = MPP_NOK;
    }
    else {
      MVar1 = _mpp_port_enqueue("enqueue",port,task);
      if (MVar1 == MPP_OK) {
        notify(this,flag);
        MVar1 = MPP_OK;
      }
    }
    return MVar1;
  }
  return MPP_ERR_INIT;
}

Assistant:

MPP_RET Mpp::enqueue(MppPortType type, MppTask task)
{
    if (!mInitDone)
        return MPP_ERR_INIT;

    MPP_RET ret = MPP_NOK;
    MppTaskQueue port = NULL;
    RK_U32 notify_flag = 0;

    set_io_mode(MPP_IO_MODE_TASK);

    switch (type) {
    case MPP_PORT_INPUT : {
        port = mUsrInPort;
        notify_flag = MPP_INPUT_ENQUEUE;
    } break;
    case MPP_PORT_OUTPUT : {
        port = mUsrOutPort;
        notify_flag = MPP_OUTPUT_ENQUEUE;
    } break;
    default : {
    } break;
    }

    if (port) {
        ret = mpp_port_enqueue(port, task);
        // if enqueue success wait up thread
        if (MPP_OK == ret)
            notify(notify_flag);
    }

    return ret;
}